

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_formatter.cpp
# Opt level: O3

size_t __thiscall
bidfx_public_api::price::subject::SubjectFormatter::NumericCharacterEntity::NextDecodedChar
          (NumericCharacterEntity *this,stringstream *ss,string *s,size_t start)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  pointer pcVar4;
  ulong uVar5;
  char local_12;
  char local_11;
  
  uVar5 = start + 1;
  uVar3 = s->_M_string_length;
  if (uVar5 < uVar3) {
    pcVar4 = (s->_M_dataplus)._M_p;
    if (pcVar4[uVar5] == '#') {
      uVar5 = start + 2;
      if (uVar3 <= uVar5) goto LAB_001a481f;
      if ((byte)(pcVar4[uVar5] - 0x30U) < 10) {
        uVar5 = start + 3;
        if (uVar3 <= uVar5) goto LAB_001a481f;
        uVar5 = start + 4;
        cVar2 = pcVar4[start + 3];
        while (cVar2 < ':') {
          if (uVar3 == uVar5) goto LAB_001a47f8;
          pcVar1 = pcVar4 + uVar5;
          uVar5 = uVar5 + 1;
          cVar2 = *pcVar1;
        }
        if (cVar2 == ';') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),&local_12,1);
          return uVar5 - 1;
        }
      }
    }
LAB_001a47f8:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),&local_11,1);
    return start;
  }
LAB_001a481f:
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar5);
}

Assistant:

size_t SubjectFormatter::NumericCharacterEntity::NextDecodedChar(std::stringstream &ss, std::string s, size_t start)
{
    size_t i = start + 1;
    char c = s.at(i++);

    if (c == '#')
    {
        c = s.at(i++);

        if (c >= '0' && c <= '9')
        {
            int code = c - '0';

            for (c = s.at(i++); c <= '9'; c = s.at(i++))
            {
                if (i == s.length()) { break; }

                code *= 10;
                code += c - '0';
            }

            if (c == ';')
            {
                ss << (char) code;
                return i - 1;
            }
        }
    }

    ss << '&';
    return start;
}